

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O0

void __thiscall PEFile::wrapCore(PEFile *this)

{
  mapped_type *ppEVar1;
  key_type local_60;
  uint local_58;
  int i;
  undefined1 local_48 [8];
  WatchedLocker lock;
  PEFile *this_local;
  
  lock._48_8_ = this;
  WatchedLocker::WatchedLocker((WatchedLocker *)local_48,&this->m_peMutex,false,"wrapCore");
  PECore::wrap(&this->core,(this->super_MappedExe).super_Executable.buf);
  for (local_58 = 0; local_58 < 6; local_58 = local_58 + 1) {
    local_60 = (key_type)(int)local_58;
    ppEVar1 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](&(this->super_MappedExe).super_ExeWrappersContainer.wrappers,&local_60);
    (*((*ppEVar1)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])();
  }
  (*(this->sects->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
    super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xb])();
  WatchedLocker::~WatchedLocker((WatchedLocker *)local_48);
  return;
}

Assistant:

void PEFile::wrapCore()
{
    WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
    // rewrap the core:
    core.wrap(this->buf);
    // rewrap the PE headers:
    for (int i = 0; i < WR_DIR_ENTRY; i++) {
        this->wrappers[i]->wrap();
    }
    // rewrap the sections:
    this->sects->wrap();
}